

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>::
operator()(PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>_>
           *this,char *value_text,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x)

{
  undefined1 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  ostream *poVar2;
  char *in_RDX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult *in_RDI;
  AssertionResult AVar3;
  stringstream ss;
  StringMatchResultListener listener;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  matcher;
  StringMatchResultListener *in_stack_fffffffffffffbf8;
  StringMatchResultListener *in_stack_fffffffffffffc00;
  StringMatchResultListener *in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc30;
  AssertionResult *this_00;
  string local_3b8 [48];
  string local_388 [32];
  stringstream local_368 [16];
  ostream local_358 [376];
  undefined4 local_1e0;
  MatchResultListener *in_stack_fffffffffffffe38;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  
  this_00 = in_RDI;
  SafeMatcherCast<std::__cxx11::string_const&,testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
            ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)in_RDI);
  StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffc20);
  uVar1 = MatchPrintAndExplain<std::__cxx11::string_const,std::__cxx11::string_const&>
                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if ((bool)uVar1) {
    AssertionSuccess();
    local_1e0 = 1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_368);
    value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::operator<<(local_358,"Value of: ");
    poVar2 = std::operator<<((ostream *)value,in_RDX);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Expected: ");
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::DescribeTo((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffffc00,(ostream *)in_stack_fffffffffffffbf8);
    poVar2 = std::operator<<(local_358,"\n  Actual: ");
    StringMatchResultListener::str_abi_cxx11_(in_stack_fffffffffffffbf8);
    std::operator<<(poVar2,local_388);
    std::__cxx11::string::~string(local_388);
    AssertionFailure();
    std::__cxx11::stringstream::str();
    in_stack_fffffffffffffc00 =
         (StringMatchResultListener *)
         AssertionResult::operator<<
                   ((AssertionResult *)CONCAT17(uVar1,in_stack_fffffffffffffc30),value);
    AssertionResult::AssertionResult(this_00,in_RDI);
    std::__cxx11::string::~string(local_3b8);
    AssertionResult::~AssertionResult((AssertionResult *)0x162739);
    local_1e0 = 1;
    std::__cxx11::stringstream::~stringstream(local_368);
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffc00);
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)0x1627f6);
  AVar3.message_.ptr_ = extraout_RDX.ptr_;
  AVar3._0_8_ = this_00;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener))
      return AssertionSuccess();

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }